

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  mz_zip_internal_state *pmVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  byte bVar24;
  bool bVar25;
  size_t local_40;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar5 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar5 == (mz_zip_internal_state *)0x0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (((((pmVar5->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
      (pComment == (char *)0x0 && (flags & 0x300) == 0)) &&
     ((pmVar5->m_sorted_central_dir_offsets).m_size != 0)) {
    pvVar6 = (pmVar5->m_sorted_central_dir_offsets).m_p;
    uVar4 = pZip->m_total_files;
    sVar11 = strlen(pName);
    if (pIndex != (mz_uint32 *)0x0) {
      *pIndex = 0;
    }
    if ((ulong)uVar4 != 0) {
      lVar14 = 0;
      lVar9 = (ulong)uVar4 - 1;
      while (lVar22 = lVar9, lVar14 <= lVar22) {
        uVar16 = (lVar22 - lVar14 >> 1) + lVar14;
        uVar4 = *(uint *)((long)pvVar6 + (uVar16 & 0xffffffff) * 4);
        pvVar23 = (pmVar5->m_central_dir).m_p;
        uVar12 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + (ulong)uVar4 * 4);
        uVar3 = *(ushort *)((long)pvVar23 + uVar12 + 0x1c);
        uVar20 = (ulong)uVar3;
        if ((uint)sVar11 <= (uint)uVar3) {
          uVar20 = sVar11 & 0xffffffff;
        }
        bVar18 = 0;
        for (uVar21 = 0; pbVar1 = (byte *)((long)pvVar23 + uVar21 + uVar12 + 0x2e), bVar24 = bVar18,
            pbVar1 < (byte *)((long)pvVar23 + uVar20 + 0x2e + uVar12); uVar21 = uVar21 + 1) {
          bVar24 = *pbVar1;
          bVar2 = pName[uVar21];
          bVar18 = bVar24 + 0x20;
          if (0x19 < (byte)(bVar24 + 0xbf)) {
            bVar18 = bVar24;
          }
          bVar24 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar24 = bVar2;
          }
          if (bVar18 != bVar24) break;
        }
        iVar10 = (uint)bVar18 - (uint)bVar24;
        if (uVar20 == uVar21) {
          iVar10 = (uint)uVar3 - (uint)sVar11;
        }
        if (iVar10 == 0) {
          if (pIndex != (mz_uint32 *)0x0) {
            *pIndex = uVar4;
            return 1;
          }
          return 1;
        }
        lVar9 = uVar16 - 1;
        if (iVar10 < 0) {
          lVar14 = uVar16 + 1;
          lVar9 = lVar22;
        }
      }
    }
    pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
    return 0;
  }
  sVar11 = strlen(pName);
  if (sVar11 < 0x10000) {
    if (pComment == (char *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = strlen(pComment);
      if (0xffff < local_40) goto LAB_0011630a;
    }
    uVar4 = pZip->m_total_files;
    for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
      pvVar6 = (pmVar5->m_central_dir).m_p;
      uVar20 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar16 * 4);
      uVar3 = *(ushort *)((long)pvVar6 + uVar20 + 0x1c);
      uVar12 = (ulong)uVar3;
      if (sVar11 <= uVar12) {
        pvVar23 = (void *)((long)pvVar6 + uVar20 + 0x2e);
        if (local_40 == 0) {
LAB_00116411:
          if (((flags >> 9 & 1) != 0) && (uVar3 != 0)) {
            do {
              uVar15 = *(byte *)((long)pvVar6 + uVar12 + uVar20 + 0x2d) - 0x2f;
              if ((uVar15 < 0x2e) && ((0x200000000801U >> ((ulong)uVar15 & 0x3f) & 1) != 0))
              goto LAB_00116450;
              bVar7 = 1 < (long)uVar12;
              uVar12 = uVar12 - 1;
            } while (bVar7);
            uVar12 = 0;
LAB_00116450:
            pvVar23 = (void *)((long)pvVar23 + (uVar12 & 0xffffffff));
            uVar12 = (ulong)((uint)uVar3 - (int)uVar12);
          }
          if (sVar11 == uVar12) {
            if ((flags >> 8 & 1) == 0) {
              sVar13 = 0;
              do {
                if (sVar11 == sVar13) {
                  bVar25 = false;
                  goto LAB_001164c7;
                }
                bVar18 = pName[sVar13];
                iVar10 = bVar18 + 0x20;
                if (0x19 < (byte)(bVar18 + 0xbf)) {
                  iVar10 = (int)(char)bVar18;
                }
                bVar18 = *(byte *)((long)pvVar23 + sVar13);
                iVar8 = bVar18 + 0x20;
                if (0x19 < (byte)(bVar18 + 0xbf)) {
                  iVar8 = (int)(char)bVar18;
                }
                sVar13 = sVar13 + 1;
              } while (iVar10 == iVar8);
            }
            else {
              iVar10 = bcmp(pName,pvVar23,sVar11);
              bVar25 = iVar10 != 0;
LAB_001164c7:
              bVar7 = (bool)(bVar25 ^ 1);
              if ((pIndex != (mz_uint32 *)0x0) && (!bVar25)) {
                *pIndex = (mz_uint32)uVar16;
                return 1;
              }
LAB_001164f1:
              if (bVar7) {
                return 1;
              }
            }
          }
        }
        else {
          uVar21 = (ulong)*(ushort *)((long)pvVar6 + uVar20 + 0x20);
          if (local_40 == uVar21) {
            uVar19 = (ulong)*(ushort *)((long)pvVar6 + uVar20 + 0x1e);
            if ((flags >> 8 & 1) != 0) {
              iVar10 = bcmp(pComment,(void *)((long)pvVar23 + uVar12 + uVar19),local_40);
              bVar7 = false;
              if (iVar10 == 0) goto LAB_00116411;
              goto LAB_001164f1;
            }
            uVar17 = 0;
            do {
              if (uVar21 == uVar17) goto LAB_00116411;
              bVar18 = pComment[uVar17];
              iVar10 = bVar18 + 0x20;
              if (0x19 < (byte)(bVar18 + 0xbf)) {
                iVar10 = (int)(char)bVar18;
              }
              bVar18 = *(byte *)((long)pvVar6 + uVar17 + uVar19 + uVar20 + uVar12 + 0x2e);
              iVar8 = bVar18 + 0x20;
              if (0x19 < (byte)(bVar18 + 0xbf)) {
                iVar8 = (int)(char)bVar18;
              }
              uVar17 = uVar17 + 1;
            } while (iVar10 == iVar8);
          }
        }
      }
    }
    pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
  }
  else {
LAB_0011630a:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
  }
  return 0;
}

Assistant:

inline mz_bool
mz_zip_reader_locate_file_v2(mz_zip_archive* pZip, const char* pName, const char* pComment, mz_uint flags,
                             mz_uint32* pIndex) {

    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0)
            && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)
            && ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment)
            && (pZip->m_pState->m_sorted_central_dir_offsets.m_size)) {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
        const mz_uint8* pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir,
                                                        mz_uint8,
                                                        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                                                             mz_uint32,
                                                                             file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char* pFilename = (const char*)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len) {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(
                    pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char* pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len)
                    || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
            int ofs = filename_len - 1;
            do {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags))) {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}